

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chess.cpp
# Opt level: O2

void __thiscall EvaluatorStandard::EvaluatorStandard(EvaluatorStandard *this)

{
  EvaluatorWeighted *this_00;
  
  (this->super_EvaluatorWeighted).m_Evaluators.
  super__Vector_base<EvaluatorBase_*,_std::allocator<EvaluatorBase_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_EvaluatorWeighted).m_Evaluators.
  super__Vector_base<EvaluatorBase_*,_std::allocator<EvaluatorBase_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_EvaluatorWeighted).m_Weights.super__Vector_base<float,_std::allocator<float>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_EvaluatorWeighted).m_Evaluators.
  super__Vector_base<EvaluatorBase_*,_std::allocator<EvaluatorBase_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_EvaluatorWeighted).m_Weights.super__Vector_base<float,_std::allocator<float>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_EvaluatorWeighted).m_Weights.super__Vector_base<float,_std::allocator<float>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_EvaluatorWeighted).super_EvaluatorBase._vptr_EvaluatorBase =
       (_func_int **)&PTR_Evaluate_00122b58;
  (this->m_Material).super_EvaluatorSlowMaterial.super_EvaluatorBase._vptr_EvaluatorBase =
       (_func_int **)&PTR_Evaluate_00122bc8;
  (this->m_SimpleMobility).super_EvaluatorBase._vptr_EvaluatorBase =
       (_func_int **)&PTR_Evaluate_00122c00;
  (this->m_PieceSquareEvaluator).super_EvaluatorBase._vptr_EvaluatorBase =
       (_func_int **)&PTR_Evaluate_00122c38;
  (this->m_MopUp).super_EvaluatorBase._vptr_EvaluatorBase = (_func_int **)&PTR_Evaluate_00122c70;
  (this->m_MopUp).whiteKing = 99;
  (this->m_MopUp).blackKing = 99;
  (this->m_MopUp).dist = 0;
  this_00 = &this->m_Weighted;
  (this->m_Weighted).super_EvaluatorBase._vptr_EvaluatorBase = (_func_int **)&PTR_Evaluate_00122ba8;
  (this->m_Weighted).m_Weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_Weighted).m_Weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_Weighted).m_Weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_Weighted).m_Evaluators.
  super__Vector_base<EvaluatorBase_*,_std::allocator<EvaluatorBase_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_Weighted).m_Evaluators.
  super__Vector_base<EvaluatorBase_*,_std::allocator<EvaluatorBase_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_Weighted).m_Evaluators.
  super__Vector_base<EvaluatorBase_*,_std::allocator<EvaluatorBase_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  EvaluatorWeighted::Add(this_00,(EvaluatorBase *)&this->m_Material,1.0);
  EvaluatorWeighted::Add(this_00,&(this->m_SimpleMobility).super_EvaluatorBase,0.1);
  EvaluatorWeighted::Add(this_00,&(this->m_PieceSquareEvaluator).super_EvaluatorBase,0.8);
  return;
}

Assistant:

EvaluatorStandard()
    {
        m_Weighted.Add( m_Material );
        m_Weighted.Add( m_SimpleMobility, 0.1f );
        m_Weighted.Add( m_PieceSquareEvaluator, 0.8f );
    }